

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blockers_triangles_iterators.h
# Opt level: O0

Simplex * __thiscall
Gudhi::skeleton_blocker::
Triangle_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
::dereference(Simplex *__return_storage_ptr__,
             Triangle_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
             *this)

{
  Edge_handle edge_handle;
  Edge_handle edge_handle_00;
  Root_vertex_handle RVar1;
  element_type *peVar2;
  Graph_edge *pGVar3;
  reference_type_of_temporary_wrapper pVVar4;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> local_88;
  boost_vertex_handle local_80;
  boost_vertex_handle local_6c;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> local_68;
  Vertex_handle local_60;
  Vertex_handle local_5c;
  reference local_58;
  uint local_3c;
  undefined1 auStack_38 [4];
  Root_vertex_handle v2;
  unsigned_long uStack_30;
  property_type *local_28;
  Root_vertex_handle v1;
  Triangle_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  *this_local;
  
  peVar2 = std::
           __shared_ptr_access<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->link_);
  boost::iterators::detail::
  iterator_facade_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
  ::operator*((reference *)auStack_38,
              (iterator_facade_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
               *)&this->current_edge_);
  edge_handle.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target = uStack_30;
  edge_handle.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = _auStack_38;
  edge_handle.m_eproperty = local_28;
  pGVar3 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
           operator[]((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                       *)peVar2,edge_handle);
  RVar1 = Skeleton_blocker_simple_traits::Graph_edge::first(pGVar3);
  peVar2 = std::
           __shared_ptr_access<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->link_);
  boost::iterators::detail::
  iterator_facade_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
  ::operator*(&local_58,
              (iterator_facade_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
               *)&this->current_edge_);
  edge_handle_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
       local_58.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
  edge_handle_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
       local_58.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
  edge_handle_00.m_eproperty = local_58.m_eproperty;
  pGVar3 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
           operator[]((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                       *)peVar2,edge_handle_00);
  local_3c = (uint)Skeleton_blocker_simple_traits::Graph_edge::second(pGVar3);
  local_5c.vertex = (this->v_).vertex;
  local_6c = RVar1.vertex;
  (*this->complex_->_vptr_Skeleton_blocker_complex[3])
            (&local_68,this->complex_,(ulong)(uint)RVar1.vertex);
  pVVar4 = boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
           operator*(&local_68);
  local_60.vertex = pVVar4->vertex;
  (*this->complex_->_vptr_Skeleton_blocker_complex[3])(&local_88,this->complex_,(ulong)local_3c);
  pVVar4 = boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
           operator*(&local_88);
  local_80 = pVVar4->vertex;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            (__return_storage_ptr__,local_5c,local_60,(Vertex_handle)local_80);
  boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::~optional
            (&local_88);
  boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::~optional
            (&local_68);
  return __return_storage_ptr__;
}

Assistant:

Simplex dereference() const {
    Root_vertex_handle v1 = (*link_)[*current_edge_].first();
    Root_vertex_handle v2 = (*link_)[*current_edge_].second();
    return Simplex(v_, *(complex_->get_address(v1)), *(complex_->get_address(v2)));
  }